

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  pointer ppFVar2;
  bool bVar3;
  int iVar4;
  FieldGenerator *pFVar5;
  char *format_00;
  byte bVar6;
  pointer ppFVar7;
  undefined1 local_b0 [8];
  Iterator __end3;
  Formatter format;
  Iterator __end4;
  Iterator __begin3;
  Iterator __begin4;
  
  __end3.descriptor = (Descriptor *)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  Formatter::operator()<>
            ((Formatter *)&__end3.descriptor,"void $classname$::ArenaDtor(void* object) {\n");
  google::protobuf::io::Printer::Indent();
  Formatter::operator()<>
            ((Formatter *)&__end3.descriptor,
             "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n");
  ppFVar7 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar7 == ppFVar2) {
    bVar6 = 0;
  }
  else {
    bVar6 = 0;
    do {
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar7);
      iVar4 = (*pFVar5->_vptr_FieldGenerator[0x11])(pFVar5,printer);
      bVar6 = bVar6 | (byte)iVar4;
      ppFVar7 = ppFVar7 + 1;
    } while (ppFVar7 != ppFVar2);
  }
  __end3._0_8_ = this->descriptor_;
  __end4.descriptor._0_4_ = 0;
  local_b0._0_4_ = *(undefined4 *)(__end3._0_8_ + 0x70);
  __begin3._0_8_ = __end3._0_8_;
  while (bVar3 = operator==((Iterator *)&__end4.descriptor,(Iterator *)local_b0), !bVar3) {
    lVar1 = *(long *)(__begin3._0_8_ + 0x30) + (long)(int)__end4.descriptor * 0x30;
    __begin3.descriptor._0_4_ = 0;
    format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         *(undefined4 *)
          (*(long *)(__begin3._0_8_ + 0x30) + 0x18 + (long)(int)__end4.descriptor * 0x30);
    __end4._0_8_ = lVar1;
    while (bVar3 = operator==((Iterator *)&__begin3.descriptor,
                              (Iterator *)
                              &format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count),
          !bVar3) {
      pFVar5 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          *(FieldDescriptor **)
                           (*(long *)(lVar1 + 0x20) + (long)(int)__begin3.descriptor * 8));
      iVar4 = (*pFVar5->_vptr_FieldGenerator[0x11])(pFVar5,printer);
      bVar6 = bVar6 | (byte)iVar4;
      __begin3.descriptor._0_4_ = (int)__begin3.descriptor + 1;
    }
    __end4.descriptor._0_4_ = (int)__end4.descriptor + 1;
  }
  if (this->num_weak_fields_ != 0) {
    bVar6 = 1;
    Formatter::operator()<>((Formatter *)&__end3.descriptor,"_this->_weak_field_map_.ClearAll();\n")
    ;
  }
  google::protobuf::io::Printer::Outdent();
  Formatter::operator()<>((Formatter *)&__end3.descriptor,"}\n");
  format_00 = "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n}\n";
  if ((bVar6 & 1) != 0) {
    format_00 = 
    "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* arena) {\n  if (arena != nullptr) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
    ;
  }
  Formatter::operator()<>((Formatter *)&__end3.descriptor,format_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void MessageGenerator::GenerateArenaDestructorCode(io::Printer* printer) {
  Formatter format(printer, variables_);

  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  format("void $classname$::ArenaDtor(void* object) {\n");
  format.Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  format(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n");

  bool need_registration = false;
  // Process non-oneof fields first.
  for (auto field : optimized_order_) {
    if (field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    for (auto field : FieldRange(oneof)) {
      if (IsFieldUsed(field, options_) &&
          field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }
  if (num_weak_fields_) {
    // _this is the object being destructed (we are inside a static method
    // here).
    format("_this->_weak_field_map_.ClearAll();\n");
    need_registration = true;
  }

  format.Outdent();
  format("}\n");

  if (need_registration) {
    format(
        "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* "
        "arena) {\n"
        "  if (arena != nullptr) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n");
  } else {
    format(
        "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n"
        "}\n");
  }
}